

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataAccessInterface.cpp
# Opt level: O0

vector<cali::Attribute,_std::allocator<cali::Attribute>_> * __thiscall
cali::CaliperMetadataAccessInterface::find_attributes_with_prop
          (vector<cali::Attribute,_std::allocator<cali::Attribute>_> *__return_storage_ptr__,
          CaliperMetadataAccessInterface *this,int prop)

{
  bool bVar1;
  uint uVar2;
  reference pAVar3;
  Attribute local_60;
  Attribute attr;
  iterator __end1;
  iterator __begin1;
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> *__range1;
  undefined1 local_38 [8];
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> vec;
  int prop_local;
  CaliperMetadataAccessInterface *this_local;
  vector<cali::Attribute,_std::allocator<cali::Attribute>_> *ret;
  
  vec.super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = prop;
  (*this->_vptr_CaliperMetadataAccessInterface[3])(local_38);
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::vector(__return_storage_ptr__);
  __end1 = std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::begin
                     ((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_38);
  attr.m_node = (Node *)std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::end
                                  ((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)
                                   local_38);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<cali::Attribute_*,_std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>_>
                                     *)&attr), bVar1) {
    pAVar3 = __gnu_cxx::
             __normal_iterator<cali::Attribute_*,_std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>_>
             ::operator*(&__end1);
    local_60.m_node = pAVar3->m_node;
    uVar2 = Attribute::properties(&local_60);
    if ((uVar2 & vec.super__Vector_base<cali::Attribute,_std::allocator<cali::Attribute>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_) != 0) {
      std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::push_back
                (__return_storage_ptr__,&local_60);
    }
    __gnu_cxx::
    __normal_iterator<cali::Attribute_*,_std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>_>
    ::operator++(&__end1);
  }
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::~vector
            ((vector<cali::Attribute,_std::allocator<cali::Attribute>_> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Attribute> CaliperMetadataAccessInterface::find_attributes_with_prop(int prop) const
{
    std::vector<Attribute> vec = get_all_attributes();
    std::vector<Attribute> ret;

    for (Attribute attr : vec)
        if (attr.properties() & prop)
            ret.push_back(attr);

    return ret;
}